

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O0

void __thiscall QNetworkReplyHttpImplPrivate::_q_startOperation(QNetworkReplyHttpImplPrivate *this)

{
  QNetworkReplyHttpImplPrivate *in_RDI;
  QNetworkRequest *in_stack_00000290;
  QNetworkReplyHttpImplPrivate *in_stack_00000298;
  undefined1 in_stack_ffffffffffffffef;
  
  if ((int)in_RDI->state < 2) {
    in_RDI->state = Working;
    postRequest(in_stack_00000298,in_stack_00000290);
    setupTransferTimeout(this);
    if ((in_RDI->synchronous & 1U) != 0) {
      in_RDI->state = Finished;
      q_func(in_RDI);
      QNetworkReply::setFinished((QNetworkReply *)in_RDI,(bool)in_stack_ffffffffffffffef);
    }
  }
  return;
}

Assistant:

void QNetworkReplyHttpImplPrivate::_q_startOperation()
{
    // Ensure this function is only being called once, and not at all if we were
    // cancelled
    if (state >= Working)
        return;

    state = Working;

    postRequest(request);

    setupTransferTimeout();
    if (synchronous) {
        state = Finished;
        q_func()->setFinished(true);
    }
}